

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

value_ptr __thiscall ent::value::readvalue(value *this,uint32_t id,ByteVector *data)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t next;
  stringvalue *this_00;
  muistringvalue *this_01;
  dwordvalue *this_02;
  stringlistvalue *this_03;
  binaryvalue *this_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar4;
  ByteVector valdata;
  string name;
  Wstring w;
  string local_78;
  MemoryReader r;
  
  r._mem = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  r._size = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)r._mem;
  r.super_ReadWriter._vptr_ReadWriter = (_func_int **)&PTR__ReadWriter_00139348;
  r._curpos = 0;
  r.super_ReadWriter._readonly = true;
  r.super_ReadWriter._9_1_ = 0;
  next = ReadWriter::read32le(&r.super_ReadWriter);
  uVar1 = ReadWriter::read16le(&r.super_ReadWriter);
  uVar2 = ReadWriter::read16le(&r.super_ReadWriter);
  uVar3 = ReadWriter::read16le(&r.super_ReadWriter);
  w._M_dataplus._M_p = (pointer)&w.field_2;
  w._M_string_length = 0;
  w.field_2._M_local_buf[0] = 0;
  readutf16le<MemoryReader*>(&r,&w,(ulong)uVar3);
  ToString<unsigned_short>(&name,&w);
  valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectorread8<MemoryReader*>(&r,&valdata,(ulong)uVar2);
  switch(uVar1) {
  case 1:
    this_00 = (stringvalue *)operator_new(0x90);
    stringvalue::stringvalue(this_00,id,next,&name,&valdata);
    std::__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ent::stringvalue,void>
              ((__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    break;
  case 3:
    this_04 = (binaryvalue *)operator_new(0x88);
    binaryvalue::binaryvalue(this_04,id,next,&name,&valdata);
    std::__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ent::binaryvalue,void>
              ((__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2> *)this,this_04);
    break;
  case 4:
    this_02 = (dwordvalue *)operator_new(0x78);
    dwordvalue::dwordvalue(this_02,id,next,&name,&valdata);
    std::__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ent::dwordvalue,void>
              ((__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2> *)this,this_02);
    break;
  case 7:
    this_03 = (stringlistvalue *)operator_new(0x88);
    stringlistvalue::stringlistvalue(this_03,id,next,&name,&valdata);
    std::__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<ent::stringlistvalue,void>
              ((__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2> *)this,this_03);
    break;
  default:
    if (uVar1 == 0x15) {
      this_01 = (muistringvalue *)operator_new(0x90);
      muistringvalue::muistringvalue(this_01,id,next,&name,&valdata);
      std::__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<ent::muistringvalue,void>
                ((__shared_ptr<ent::value,(__gnu_cxx::_Lock_policy)2> *)this,this_01);
      break;
    }
  case 2:
  case 5:
  case 6:
    vhexdump<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_78,&valdata);
    printf("WARNING: unsupported value type %d ( next:%08x name:%s, val:%s )\n",(ulong)uVar1,
           (ulong)next,name._M_dataplus._M_p,local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter = (_func_int **)0x0;
    *(undefined8 *)&(this->super_base).super_MemoryReader.super_ReadWriter._readonly = 0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&valdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  ~basic_string(&w);
  vVar4.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar4.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (value_ptr)vVar4.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr value::readvalue(uint32_t id, const ByteVector& data)
{
    MemoryReader r(&data.front(), data.size());
    uint32_t nextvalue= r.read32le();
    uint16_t type= r.read16le();   // 1, 3, 4, 7, 21
    uint16_t vallen= r.read16le();  // max 0xc5a
    uint16_t namlen= r.read16le();  // max 0x75

    std::Wstring w;
    readutf16le(&r, w, namlen);
    std::string name= ToString(w);

    ByteVector valdata;
    vectorread8(&r, valdata, vallen);

    switch(type)
    {
        case VT_STRING: return value_ptr(new stringvalue(id, nextvalue, name, valdata));
        case VT_BINARY: return value_ptr(new binaryvalue(id, nextvalue, name, valdata));
        case VT_DWORD:  return value_ptr(new dwordvalue(id, nextvalue, name, valdata));
        case VT_STRINGLIST: return value_ptr(new stringlistvalue(id, nextvalue, name, valdata));
        case VT_MUI:    return value_ptr(new muistringvalue(id, nextvalue, name, valdata));
        default:
                        printf("WARNING: unsupported value type %d ( next:%08x name:%s, val:%s )\n", type, nextvalue, name.c_str(), vhexdump(valdata).c_str());
    }
    return value_ptr();
}